

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

void stbiw__write_hdr_scanline(FILE *f,int width,int comp,uchar *scratch,float *scanline)

{
  long lVar1;
  FILE *f_00;
  uchar *puVar2;
  FILE *f_01;
  uchar uVar3;
  long lVar4;
  uchar uVar5;
  uchar uVar6;
  uint uVar7;
  uchar uVar8;
  uchar *puVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  char local_8c [4];
  char local_88 [4];
  uint local_84;
  uchar *local_80;
  long local_78;
  FILE *local_70;
  ulong local_68;
  undefined4 local_5c;
  float fStack_58;
  uchar scanlineheader [4];
  float local_50;
  float local_48;
  float local_40;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  char local_31;
  
  local_5c = CONCAT22((ushort)width << 8 | (ushort)width >> 8,0x202);
  local_70 = (FILE *)f;
  if (width - 0x8000U < 0xffff8008) {
    if (0 < width) {
      uVar11 = (ulong)(uint)width;
      do {
        if (comp - 1U < 2) {
          local_50 = *scanline;
          local_40 = local_50;
          local_48 = local_50;
        }
        else if (comp - 3U < 2) {
          local_50 = *scanline;
          local_40 = scanline[1];
          local_48 = scanline[2];
        }
        fVar16 = local_40;
        if (local_40 <= local_48) {
          fVar16 = local_48;
        }
        fVar15 = local_50;
        if (local_50 <= fVar16) {
          fVar15 = fVar16;
        }
        if (1e-32 <= fVar15) {
          _fStack_58 = CONCAT44(scanlineheader,fVar15);
          fVar16 = frexpf(fVar15,(int *)local_88);
          fVar16 = (fVar16 * 256.0) / fStack_58;
          local_34 = (undefined1)(int)(local_50 * fVar16);
          local_33 = (undefined1)(int)(local_40 * fVar16);
          local_32 = (undefined1)(int)(fVar16 * local_48);
          local_31 = local_88[0] + -0x80;
        }
        else {
          local_33 = 0;
          local_34 = 0;
          local_31 = '\0';
          local_32 = 0;
        }
        fwrite(&local_34,4,1,local_70);
        scanline = scanline + comp;
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
    }
  }
  else {
    uVar11 = 0;
    uVar7 = comp - 1;
    local_84 = uVar7;
    local_80 = scratch;
    local_68 = (ulong)(uint)width;
    do {
      if (uVar7 < 2) {
        in_XMM2_Da = *scanline;
        in_XMM3_Da = in_XMM2_Da;
        in_XMM4_Da = in_XMM2_Da;
      }
      else if (comp - 3U < 2) {
        in_XMM2_Da = scanline[2];
        in_XMM3_Da = *scanline;
        in_XMM4_Da = scanline[1];
      }
      fVar16 = in_XMM4_Da;
      if (in_XMM4_Da <= in_XMM2_Da) {
        fVar16 = in_XMM2_Da;
      }
      fVar15 = in_XMM3_Da;
      if (in_XMM3_Da <= fVar16) {
        fVar15 = fVar16;
      }
      if (1e-32 <= fVar15) {
        _fStack_58 = CONCAT44(scanlineheader,in_XMM4_Da);
        local_78 = CONCAT44(local_78._4_4_,fVar15);
        fVar16 = frexpf(fVar15,(int *)local_8c);
        fVar16 = (fVar16 * 256.0) / (float)local_78;
        uVar6 = (uchar)(int)(in_XMM3_Da * fVar16);
        uVar5 = (uchar)(int)(fStack_58 * fVar16);
        uVar8 = (uchar)(int)(fVar16 * in_XMM2_Da);
        uVar3 = local_8c[0] + 0x80;
        in_XMM4_Da = fStack_58;
        uVar7 = local_84;
      }
      else {
        uVar5 = '\0';
        uVar6 = '\0';
        uVar3 = '\0';
        uVar8 = '\0';
      }
      local_80[uVar11] = uVar6;
      scratch[uVar11 + (uint)width] = uVar5;
      scratch[uVar11 + (uint)(width * 2)] = uVar8;
      scratch[uVar11 + (uint)(width * 3)] = uVar3;
      uVar11 = uVar11 + 1;
      scanline = scanline + comp;
    } while (local_68 != uVar11);
    fwrite(&local_5c,4,1,local_70);
    _fStack_58 = local_68 - 3;
    local_78 = 0;
    puVar9 = local_80;
    do {
      puVar2 = local_80;
      lVar10 = local_78 * local_68;
      iVar14 = 0;
      do {
        f_01 = local_70;
        f_00 = local_70;
        iVar13 = width;
        if (iVar14 + 2 < width) {
          lVar4 = (long)iVar14 + -1;
          uVar3 = puVar2[iVar14 + lVar10];
          iVar12 = iVar14;
          do {
            lVar1 = lVar4 + 2;
            if ((uVar3 == puVar9[lVar1]) && (iVar13 = iVar12, uVar3 == puVar9[lVar4 + 3])) break;
            iVar12 = iVar12 + 1;
            lVar4 = lVar4 + 1;
            uVar3 = puVar9[lVar1];
            iVar13 = width;
          } while (lVar4 < _fStack_58);
        }
        for (; local_70 = f_00, iVar14 < iVar13; iVar14 = iVar14 + iVar12) {
          iVar12 = iVar13 - iVar14;
          if (0x7f < iVar13 - iVar14) {
            iVar12 = 0x80;
          }
          stbiw__write_dump_data((FILE *)f_01,iVar12,puVar2 + iVar14 + lVar10);
          f_00 = local_70;
        }
        if (iVar13 + 2 < width) {
          lVar4 = (long)iVar13;
          iVar12 = iVar13 + 1;
          if (iVar13 + 1 < width) {
            iVar12 = width;
          }
          do {
            if (puVar9[lVar4] != puVar2[iVar14 + lVar10]) {
              iVar12 = (int)lVar4;
              break;
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 < (long)local_68);
          for (; iVar14 < iVar12; iVar14 = iVar14 + iVar13) {
            iVar13 = iVar12 - iVar14;
            if (0x7e < iVar12 - iVar14) {
              iVar13 = 0x7f;
            }
            stbiw__write_run_data((FILE *)f_00,iVar13,puVar2[iVar14 + lVar10]);
          }
        }
      } while (iVar14 < width);
      local_78 = local_78 + 1;
      puVar9 = puVar9 + local_68;
    } while (local_78 != 4);
  }
  return;
}

Assistant:

void stbiw__write_hdr_scanline(FILE *f, int width, int comp, unsigned char *scratch, const float *scanline)
{
   unsigned char scanlineheader[4] = { 2, 2, 0, 0 };
   unsigned char rgbe[4];
   float linear[3];
   int x;

   scanlineheader[2] = (width&0xff00)>>8;
   scanlineheader[3] = (width&0x00ff);

   /* skip RLE for images too small or large */
   if (width < 8 || width >= 32768) {
      for (x=0; x < width; x++) {
         switch (comp) {
            case 4: /* fallthrough */
            case 3: linear[2] = scanline[x*comp + 2];
                    linear[1] = scanline[x*comp + 1];
                    linear[0] = scanline[x*comp + 0];
                    break;
            case 2: /* fallthrough */
            case 1: linear[0] = linear[1] = linear[2] = scanline[x*comp + 0];
                    break;
         }
         stbiw__linear_to_rgbe(rgbe, linear);
         fwrite(rgbe, 4, 1, f);
      }
   } else {
      int c,r;
      /* encode into scratch buffer */
      for (x=0; x < width; x++) {
         switch(comp) {
            case 4: /* fallthrough */
            case 3: linear[2] = scanline[x*comp + 2];
                    linear[1] = scanline[x*comp + 1];
                    linear[0] = scanline[x*comp + 0];
                    break;
            case 2: /* fallthrough */
            case 1: linear[0] = linear[1] = linear[2] = scanline[x*comp + 0];
                    break;
         }
         stbiw__linear_to_rgbe(rgbe, linear);
         scratch[x + width*0] = rgbe[0];
         scratch[x + width*1] = rgbe[1];
         scratch[x + width*2] = rgbe[2];
         scratch[x + width*3] = rgbe[3];
      }

      fwrite(scanlineheader, 4, 1, f);

      /* RLE each component separately */
      for (c=0; c < 4; c++) {
         unsigned char *comp = &scratch[width*c];

         x = 0;
         while (x < width) {
            // find first run
            r = x;
            while (r+2 < width) {
               if (comp[r] == comp[r+1] && comp[r] == comp[r+2])
                  break;
               ++r;
            }
            if (r+2 >= width)
               r = width;
            // dump up to first run
            while (x < r) {
               int len = r-x;
               if (len > 128) len = 128;
               stbiw__write_dump_data(f, len, &comp[x]);
               x += len;
            }
            // if there's a run, output it
            if (r+2 < width) { // same test as what we break out of in search loop, so only true if we break'd
               // find next byte after run
               while (r < width && comp[r] == comp[x])
                  ++r;
               // output run up to r
               while (x < r) {
                  int len = r-x;
                  if (len > 127) len = 127;
                  stbiw__write_run_data(f, len, comp[x]);
                  x += len;
               }
            }
         }
      }
   }
}